

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

string * __thiscall
fmt::v7::detail::stringifier::operator()[abi_cxx11_
          (string *__return_storage_ptr__,stringifier *this,handle h)

{
  undefined **local_270;
  undefined1 *local_268;
  long lStack_260;
  ulong local_258;
  undefined1 local_250 [504];
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> local_58;
  parse_context local_38;
  
  lStack_260 = 0;
  local_270 = &PTR_grow_002c6bb0;
  local_258 = 500;
  local_38.format_str_.data_ = (char *)0x0;
  local_38.format_str_.size_ = 0;
  local_38.next_arg_id_ = 0;
  local_58.out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)&local_270;
  local_58.args_.desc_ = 0;
  local_58.loc_.locale_ = (void *)0x0;
  local_268 = local_250;
  (*h.custom_.format)(h.custom_.value,&local_38,&local_58);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_268,local_268 + lStack_260);
  local_270 = &PTR_grow_002c6bb0;
  if (local_268 != local_250) {
    operator_delete(local_268,local_258);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(basic_format_arg<format_context>::handle h) const {
    memory_buffer buf;
    format_parse_context parse_ctx({});
    format_context format_ctx(buffer_appender<char>(buf), {}, {});
    h.format(parse_ctx, format_ctx);
    return to_string(buf);
  }